

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

int __thiscall spvtools::val::Function::GetBlockDepth(Function *this,BasicBlock *bb)

{
  bool bVar1;
  int iVar2;
  mapped_type *pmVar3;
  mapped_type *ppCVar4;
  vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_> *this_00;
  reference ppCVar5;
  BasicBlock *bb_00;
  mapped_type *ppBVar6;
  pair<spvtools::val::BasicBlock_*,_spvtools::val::ConstructType> pVar7;
  BasicBlock *header;
  BasicBlock *loop_header;
  Construct *loop_construct;
  ConstructType local_64;
  pair<spvtools::val::BasicBlock_*,_spvtools::val::ConstructType> local_60;
  pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType> local_50;
  Construct *local_40;
  Construct *continue_construct;
  BasicBlock *bb_dom;
  _Node_iterator_base<std::pair<spvtools::val::BasicBlock_*const,_int>,_false> local_28;
  BasicBlock *local_20;
  BasicBlock *bb_local;
  Function *this_local;
  
  if (bb == (BasicBlock *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    local_20 = bb;
    bb_local = (BasicBlock *)this;
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<spvtools::val::BasicBlock_*,_int,_std::hash<spvtools::val::BasicBlock_*>,_std::equal_to<spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_int>_>_>
         ::find(&this->block_depth_,&local_20);
    bb_dom = (BasicBlock *)
             std::
             unordered_map<spvtools::val::BasicBlock_*,_int,_std::hash<spvtools::val::BasicBlock_*>,_std::equal_to<spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_int>_>_>
             ::end(&this->block_depth_);
    bVar1 = std::__detail::operator!=
                      (&local_28,
                       (_Node_iterator_base<std::pair<spvtools::val::BasicBlock_*const,_int>,_false>
                        *)&bb_dom);
    if (bVar1) {
      pmVar3 = std::
               unordered_map<spvtools::val::BasicBlock_*,_int,_std::hash<spvtools::val::BasicBlock_*>,_std::equal_to<spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_int>_>_>
               ::operator[](&this->block_depth_,&local_20);
      this_local._4_4_ = *pmVar3;
    }
    else {
      pmVar3 = std::
               unordered_map<spvtools::val::BasicBlock_*,_int,_std::hash<spvtools::val::BasicBlock_*>,_std::equal_to<spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_int>_>_>
               ::operator[](&this->block_depth_,&local_20);
      *pmVar3 = 0;
      continue_construct = (Construct *)BasicBlock::immediate_dominator(local_20);
      if (((BasicBlock *)continue_construct == (BasicBlock *)0x0) ||
         (local_20 == (BasicBlock *)continue_construct)) {
        pmVar3 = std::
                 unordered_map<spvtools::val::BasicBlock_*,_int,_std::hash<spvtools::val::BasicBlock_*>,_std::equal_to<spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_int>_>_>
                 ::operator[](&this->block_depth_,&local_20);
        *pmVar3 = 0;
      }
      else {
        bVar1 = BasicBlock::is_type(local_20,kBlockTypeContinue);
        if (bVar1) {
          local_64 = kContinue;
          pVar7 = std::make_pair<spvtools::val::BasicBlock*&,spvtools::val::ConstructType>
                            (&local_20,&local_64);
          local_60.first = pVar7.first;
          local_60.second = pVar7.second;
          std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>::
          pair<spvtools::val::BasicBlock_*,_spvtools::val::ConstructType,_true>(&local_50,&local_60)
          ;
          ppCVar4 = std::
                    unordered_map<std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>,_spvtools::val::Construct_*,_spvtools::val::bb_constr_type_pair_hash,_std::equal_to<std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>_>,_std::allocator<std::pair<const_std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>,_spvtools::val::Construct_*>_>_>
                    ::operator[](&this->entry_block_to_construct_,&local_50);
          local_40 = *ppCVar4;
          if (local_40 == (Construct *)0x0) {
            __assert_fail("continue_construct",
                          "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/function.cpp"
                          ,0x156,"int spvtools::val::Function::GetBlockDepth(BasicBlock *)");
          }
          this_00 = Construct::corresponding_constructs(local_40);
          ppCVar5 = std::
                    vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                    ::operator[](this_00,0);
          if (*ppCVar5 == (Construct *)0x0) {
            __assert_fail("loop_construct",
                          "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/function.cpp"
                          ,0x15a,"int spvtools::val::Function::GetBlockDepth(BasicBlock *)");
          }
          bb_00 = Construct::entry_block(*ppCVar5);
          if (bb_00 == local_20) {
            iVar2 = GetBlockDepth(this,(BasicBlock *)continue_construct);
            pmVar3 = std::
                     unordered_map<spvtools::val::BasicBlock_*,_int,_std::hash<spvtools::val::BasicBlock_*>,_std::equal_to<spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_int>_>_>
                     ::operator[](&this->block_depth_,&local_20);
            *pmVar3 = iVar2 + 1;
          }
          else {
            iVar2 = GetBlockDepth(this,bb_00);
            pmVar3 = std::
                     unordered_map<spvtools::val::BasicBlock_*,_int,_std::hash<spvtools::val::BasicBlock_*>,_std::equal_to<spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_int>_>_>
                     ::operator[](&this->block_depth_,&local_20);
            *pmVar3 = iVar2 + 1;
          }
        }
        else {
          bVar1 = BasicBlock::is_type(local_20,kBlockTypeMerge);
          if (bVar1) {
            ppBVar6 = std::
                      unordered_map<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::hash<spvtools::val::BasicBlock_*>,_std::equal_to<spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_spvtools::val::BasicBlock_*>_>_>
                      ::operator[](&this->merge_block_header_,&local_20);
            if (*ppBVar6 == (BasicBlock *)0x0) {
              __assert_fail("header",
                            "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/function.cpp"
                            ,0x168,"int spvtools::val::Function::GetBlockDepth(BasicBlock *)");
            }
            iVar2 = GetBlockDepth(this,*ppBVar6);
            pmVar3 = std::
                     unordered_map<spvtools::val::BasicBlock_*,_int,_std::hash<spvtools::val::BasicBlock_*>,_std::equal_to<spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_int>_>_>
                     ::operator[](&this->block_depth_,&local_20);
            *pmVar3 = iVar2;
          }
          else {
            bVar1 = BasicBlock::is_type((BasicBlock *)continue_construct,kBlockTypeSelection);
            if ((bVar1) ||
               (bVar1 = BasicBlock::is_type((BasicBlock *)continue_construct,kBlockTypeLoop), bVar1)
               ) {
              iVar2 = GetBlockDepth(this,(BasicBlock *)continue_construct);
              pmVar3 = std::
                       unordered_map<spvtools::val::BasicBlock_*,_int,_std::hash<spvtools::val::BasicBlock_*>,_std::equal_to<spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_int>_>_>
                       ::operator[](&this->block_depth_,&local_20);
              *pmVar3 = iVar2 + 1;
            }
            else {
              iVar2 = GetBlockDepth(this,(BasicBlock *)continue_construct);
              pmVar3 = std::
                       unordered_map<spvtools::val::BasicBlock_*,_int,_std::hash<spvtools::val::BasicBlock_*>,_std::equal_to<spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_int>_>_>
                       ::operator[](&this->block_depth_,&local_20);
              *pmVar3 = iVar2;
            }
          }
        }
      }
      pmVar3 = std::
               unordered_map<spvtools::val::BasicBlock_*,_int,_std::hash<spvtools::val::BasicBlock_*>,_std::equal_to<spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_int>_>_>
               ::operator[](&this->block_depth_,&local_20);
      this_local._4_4_ = *pmVar3;
    }
  }
  return this_local._4_4_;
}

Assistant:

int Function::GetBlockDepth(BasicBlock* bb) {
  // Guard against nullptr.
  if (!bb) {
    return 0;
  }
  // Only calculate the depth if it's not already calculated.
  // This function uses memoization to avoid duplicate CFG depth calculations.
  if (block_depth_.find(bb) != block_depth_.end()) {
    return block_depth_[bb];
  }
  // Avoid recursion. Something is wrong if the same block is encountered
  // multiple times.
  block_depth_[bb] = 0;

  BasicBlock* bb_dom = bb->immediate_dominator();
  if (!bb_dom || bb == bb_dom) {
    // This block has no dominator, so it's at depth 0.
    block_depth_[bb] = 0;
  } else if (bb->is_type(kBlockTypeContinue)) {
    // This rule must precede the rule for merge blocks in order to set up
    // depths correctly. If a block is both a merge and continue then the merge
    // is nested within the continue's loop (or the graph is incorrect).
    // The depth of the continue block entry point is 1 + loop header depth.
    Construct* continue_construct =
        entry_block_to_construct_[std::make_pair(bb, ConstructType::kContinue)];
    assert(continue_construct);
    // Continue construct has only 1 corresponding construct (loop header).
    Construct* loop_construct =
        continue_construct->corresponding_constructs()[0];
    assert(loop_construct);
    BasicBlock* loop_header = loop_construct->entry_block();
    // The continue target may be the loop itself (while 1).
    // In such cases, the depth of the continue block is: 1 + depth of the
    // loop's dominator block.
    if (loop_header == bb) {
      block_depth_[bb] = 1 + GetBlockDepth(bb_dom);
    } else {
      block_depth_[bb] = 1 + GetBlockDepth(loop_header);
    }
  } else if (bb->is_type(kBlockTypeMerge)) {
    // If this is a merge block, its depth is equal to the block before
    // branching.
    BasicBlock* header = merge_block_header_[bb];
    assert(header);
    block_depth_[bb] = GetBlockDepth(header);
  } else if (bb_dom->is_type(kBlockTypeSelection) ||
             bb_dom->is_type(kBlockTypeLoop)) {
    // The dominator of the given block is a header block. So, the nesting
    // depth of this block is: 1 + nesting depth of the header.
    block_depth_[bb] = 1 + GetBlockDepth(bb_dom);
  } else {
    block_depth_[bb] = GetBlockDepth(bb_dom);
  }
  return block_depth_[bb];
}